

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

ON_OBSOLETE_V5_DimExtra * ON_OBSOLETE_V5_DimExtra::Cast(ON_Object *p)

{
  bool bVar1;
  ON_OBSOLETE_V5_DimExtra *pOVar2;
  
  if (p != (ON_Object *)0x0) {
    bVar1 = ON_Object::IsKindOf(p,&m_ON_OBSOLETE_V5_DimExtra_class_rtti);
    pOVar2 = (ON_OBSOLETE_V5_DimExtra *)0x0;
    if (bVar1) {
      pOVar2 = (ON_OBSOLETE_V5_DimExtra *)p;
    }
    return pOVar2;
  }
  return (ON_OBSOLETE_V5_DimExtra *)0x0;
}

Assistant:

ON_OBSOLETE_V5_DimExtra::ON_OBSOLETE_V5_DimExtra()
{
  m_userdata_uuid = ON_CLASS_ID(ON_OBSOLETE_V5_DimExtra);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work, but SaveAs
                                         // V4 should not write this userdata.
  m_userdata_copycount = 1;
  SetDefaults();
}